

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

bool test_vector_erase(void)

{
  int *__dest;
  bool bVar1;
  int *piVar2;
  int *__src;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_59;
  undefined8 local_58;
  vector<int,_std::allocator<int>_> l;
  list<int,_std::allocator<int>_> base;
  
  base.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)0x200000001;
  base.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)0x400000003;
  base.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&base;
  std::vector<int,_std::allocator<int>_>::vector(&l,__l,(allocator_type *)&local_58);
  piVar2 = l.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __dest = l.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  while (__src = __dest + 1,
        piVar2 != l.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish) {
    if (*piVar2 < 3) {
      piVar2 = piVar2 + 1;
      __dest = __src;
    }
    else {
      if (__src != l.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish) {
        memmove(__dest,__src,
                (long)l.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src);
      }
      l.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           l.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           + -1;
      piVar2 = __dest;
    }
  }
  local_58 = 0x200000001;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_58;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&base,__l_00,&local_59);
  bVar1 = std::
          __equal4<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     l.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_start,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     l.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_finish,
                     (_List_iterator<int>)
                     base.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                     super__List_node_base._M_next,(_List_node_base *)&base);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)&base);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&l.super__Vector_base<int,_std::allocator<int>_>);
  return bVar1;
}

Assistant:

bool test_vector_erase() {
    auto l = std::vector<int>{1, 2, 3, 4, 5};
    for (auto i = l.begin(); i != l.end();) {
        if (*i >= 3) {
            i = l.erase(i);
            continue;
        }
        i++;
    }
    auto base = std::list<int>{1, 2};
    return std::equal(l.begin(), l.end(), base.begin(), base.end());
}